

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::AfterIfTrueExpr
          (ExprVisitorDelegate *this,IfExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  char *s;
  IfExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  bVar1 = intrusive_list<wabt::Expr>::empty(&expr->false_);
  if (!bVar1) {
    Dedent(this->writer_);
    this_00 = this->writer_;
    s = Opcode::GetName((Opcode *)&Opcode::Else_Opcode);
    WritePutsSpace(this_00,s);
    Indent(this->writer_);
    WriteNewline(this->writer_,true);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::AfterIfTrueExpr(IfExpr* expr) {
  if (!expr->false_.empty()) {
    writer_->Dedent();
    writer_->WritePutsSpace(Opcode::Else_Opcode.GetName());
    writer_->Indent();
    writer_->WriteNewline(FORCE_NEWLINE);
  }
  return Result::Ok;
}